

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::IntegerLiteralTypeInfo::Deserialize(IntegerLiteralTypeInfo *this,Deserializer *deserializer)

{
  IntegerLiteralTypeInfo *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar2;
  shared_ptr<duckdb::IntegerLiteralTypeInfo,_true> result;
  shared_ptr<duckdb::IntegerLiteralTypeInfo,_true> local_78;
  Value local_60;
  
  pIVar1 = (IntegerLiteralTypeInfo *)operator_new(0x78);
  IntegerLiteralTypeInfo(pIVar1);
  local_78.internal.super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pIVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::IntegerLiteralTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78.internal.
              super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pIVar1);
  pIVar1 = shared_ptr<duckdb::IntegerLiteralTypeInfo,_true>::operator->(&local_78);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"constant_value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&pIVar1->constant_value,&local_60);
  Value::~Value(&local_60);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_78.internal.
       super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_78.internal.
       super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> IntegerLiteralTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<IntegerLiteralTypeInfo>(new IntegerLiteralTypeInfo());
	deserializer.ReadProperty<Value>(200, "constant_value", result->constant_value);
	return std::move(result);
}